

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

void jsondec_field(jsondec *d,upb_Message *msg,upb_MessageDef *m)

{
  _Bool _Var1;
  int iVar2;
  upb_MessageDef *puVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  upb_OneofDef *puVar7;
  upb_FieldDef *puVar8;
  upb_MutableMessageValue msg_00;
  upb_StringView uVar9;
  undefined1 local_80 [8];
  upb_JsonMessageValue val;
  upb_MessageDef *subm;
  upb_Message *submsg;
  ulong local_48;
  upb_FieldDef *preserved;
  upb_FieldDef *f;
  upb_StringView name;
  upb_MessageDef *m_local;
  upb_Message *msg_local;
  jsondec *d_local;
  
  _Var1 = upb_Message_IsFrozen(msg);
  if (_Var1) {
    __assert_fail("!upb_Message_IsFrozen(msg)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/json/decode.c"
                  ,0x3b2,"void jsondec_field(jsondec *, upb_Message *, const upb_MessageDef *)");
  }
  uVar9 = jsondec_string(d);
  submsg = (upb_Message *)uVar9.data;
  local_48 = uVar9.size;
  jsondec_entrysep(d);
  if (((local_48 < 2) || (*(char *)&submsg->field_0 != '[')) ||
     (*(char *)((long)submsg + (local_48 - 1)) != ']')) {
    preserved = upb_MessageDef_FindByJsonNameWithSize(m,(char *)submsg,local_48);
  }
  else {
    preserved = upb_DefPool_FindExtensionByNameWithSize
                          (d->symtab,(char *)((long)&submsg->field_0 + 1),local_48 - 2);
    if ((preserved != (upb_FieldDef *)0x0) &&
       (puVar3 = upb_FieldDef_ContainingType(preserved), puVar3 != m)) {
      pcVar4 = upb_FieldDef_FullName(preserved);
      puVar3 = upb_FieldDef_ContainingType(preserved);
      pcVar5 = upb_MessageDef_FullName(puVar3);
      pcVar6 = upb_MessageDef_FullName(m);
      jsondec_errf(d,"Extension %s extends message %s, but was seen in message %s",pcVar4,pcVar5,
                   pcVar6);
    }
  }
  if (preserved == (upb_FieldDef *)0x0) {
    if ((d->options & 1U) == 0) {
      jsondec_errf(d,"No such field: %.*s",local_48 & 0xffffffff,submsg);
    }
    jsondec_skipval(d);
  }
  else {
    iVar2 = jsondec_peek(d);
    if ((iVar2 != 6) || (_Var1 = jsondec_isvalue(preserved), _Var1)) {
      puVar7 = upb_FieldDef_RealContainingOneof(preserved);
      if (puVar7 != (upb_OneofDef *)0x0) {
        puVar7 = upb_FieldDef_ContainingOneof(preserved);
        puVar8 = upb_Message_WhichOneofByDef(msg,puVar7);
        if (puVar8 != (upb_FieldDef *)0x0) {
          jsondec_err(d,"More than one field for this oneof.");
        }
      }
      puVar8 = d->debug_field;
      d->debug_field = preserved;
      _Var1 = upb_FieldDef_IsMap(preserved);
      if (_Var1) {
        jsondec_map(d,msg,preserved);
      }
      else {
        _Var1 = upb_FieldDef_IsRepeated(preserved);
        if (_Var1) {
          jsondec_array(d,msg,preserved);
        }
        else {
          _Var1 = upb_FieldDef_IsSubMessage(preserved);
          if (_Var1) {
            msg_00 = upb_Message_Mutable(msg,preserved,d->arena);
            val._16_8_ = upb_FieldDef_MessageSubDef(preserved);
            jsondec_tomsg(d,msg_00.msg,(upb_MessageDef *)val._16_8_);
          }
          else {
            jsondec_value((upb_JsonMessageValue *)local_80,d,preserved);
            if ((val.value.str_val.size._0_1_ & 1) == 0) {
              upb_Message_SetFieldByDef(msg,preserved,_local_80,d->arena);
            }
          }
        }
      }
      d->debug_field = puVar8;
    }
    else {
      jsondec_null(d);
    }
  }
  return;
}

Assistant:

static void jsondec_field(jsondec* d, upb_Message* msg,
                          const upb_MessageDef* m) {
  UPB_ASSERT(!upb_Message_IsFrozen(msg));
  upb_StringView name;
  const upb_FieldDef* f;
  const upb_FieldDef* preserved;

  name = jsondec_string(d);
  jsondec_entrysep(d);

  if (name.size >= 2 && name.data[0] == '[' &&
      name.data[name.size - 1] == ']') {
    f = upb_DefPool_FindExtensionByNameWithSize(d->symtab, name.data + 1,
                                                name.size - 2);
    if (f && upb_FieldDef_ContainingType(f) != m) {
      jsondec_errf(
          d, "Extension %s extends message %s, but was seen in message %s",
          upb_FieldDef_FullName(f),
          upb_MessageDef_FullName(upb_FieldDef_ContainingType(f)),
          upb_MessageDef_FullName(m));
    }
  } else {
    f = upb_MessageDef_FindByJsonNameWithSize(m, name.data, name.size);
  }

  if (!f) {
    if ((d->options & upb_JsonDecode_IgnoreUnknown) == 0) {
      jsondec_errf(d, "No such field: " UPB_STRINGVIEW_FORMAT,
                   UPB_STRINGVIEW_ARGS(name));
    }
    jsondec_skipval(d);
    return;
  }

  if (jsondec_peek(d) == JD_NULL && !jsondec_isvalue(f)) {
    /* JSON "null" indicates a default value, so no need to set anything. */
    jsondec_null(d);
    return;
  }

  if (upb_FieldDef_RealContainingOneof(f) &&
      upb_Message_WhichOneofByDef(msg, upb_FieldDef_ContainingOneof(f))) {
    jsondec_err(d, "More than one field for this oneof.");
  }

  preserved = d->debug_field;
  d->debug_field = f;

  if (upb_FieldDef_IsMap(f)) {
    jsondec_map(d, msg, f);
  } else if (upb_FieldDef_IsRepeated(f)) {
    jsondec_array(d, msg, f);
  } else if (upb_FieldDef_IsSubMessage(f)) {
    upb_Message* submsg = upb_Message_Mutable(msg, f, d->arena).msg;
    const upb_MessageDef* subm = upb_FieldDef_MessageSubDef(f);
    jsondec_tomsg(d, submsg, subm);
  } else {
    upb_JsonMessageValue val = jsondec_value(d, f);
    if (!val.ignore) {
      upb_Message_SetFieldByDef(msg, f, val.value, d->arena);
    }
  }

  d->debug_field = preserved;
}